

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<const_fasttext::Matrix> __thiscall fasttext::FastText::getInputMatrix(FastText *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_fasttext::Matrix> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_fasttext::Matrix> sVar1;
  
  std::shared_ptr<fasttext::Matrix_const>::shared_ptr<fasttext::Matrix,void>
            (in_RSI,(shared_ptr<fasttext::Matrix> *)in_RDI);
  sVar1.super___shared_ptr<const_fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<const_fasttext::Matrix>)
         sVar1.super___shared_ptr<const_fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Matrix> FastText::getInputMatrix() const {
  return input_;
}